

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

int pnga_local_iterator_next(_iterator_hdl *hdl,Integer *plo,Integer *phi,char **ptr,Integer *ld)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Integer IVar4;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  Integer offset;
  Integer nelems;
  int me;
  int ndim;
  Integer elemsize;
  Integer grp;
  Integer handle;
  Integer i;
  Integer *in_stack_00000258;
  void *in_stack_00000260;
  Integer in_stack_00000268;
  Integer in_stack_00000270;
  Integer *in_stack_00000298;
  Integer *in_stack_000002a0;
  Integer in_stack_000002a8;
  Integer in_stack_000002b0;
  Integer *in_stack_00000370;
  void *in_stack_00000378;
  Integer *in_stack_00000380;
  Integer *in_stack_00000388;
  Integer in_stack_00000390;
  Integer *in_stack_000003e8;
  void *in_stack_000003f0;
  Integer *in_stack_000003f8;
  Integer in_stack_00000400;
  long local_68;
  long local_38;
  
  lVar3 = *in_RDI + 1000;
  iVar1 = GA[lVar3].p_handle;
  pnga_pgroup_nodeid((long)iVar1);
  iVar2 = (int)GA[lVar3].ndim;
  if (GA[lVar3].distr_type == 0) {
    if (0 < in_RDI[0xf]) {
      return 0;
    }
    pnga_distribution(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      if (*(long *)(in_RDX + local_38 * 8) < *(long *)(in_RSI + local_38 * 8)) {
        return 0;
      }
    }
    pnga_access_ptr(in_stack_00000390,in_stack_00000388,in_stack_00000380,in_stack_00000378,
                    in_stack_00000370);
    in_RDI[0xf] = in_RDI[0xf] + 1;
  }
  else if (GA[lVar3].distr_type == 1) {
    lVar3 = in_RDI[0xf];
    IVar4 = pnga_total_blocks(*in_RDI);
    if (IVar4 <= lVar3) {
      return 0;
    }
    pnga_distribution(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
    pnga_access_block_ptr(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
    IVar4 = pnga_pgroup_nnodes((long)iVar1);
    in_RDI[0xf] = IVar4 + in_RDI[0xf];
  }
  else if ((GA[lVar3].distr_type == 2) || (GA[lVar3].distr_type == 3)) {
    if (in_RDI[(long)(iVar2 + -1) + 0x28] <= in_RDI[(long)(iVar2 + -1) + 0x59]) {
      return 0;
    }
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      *(long *)(in_RSI + local_38 * 8) = in_RDI[local_38 + 0x59] * in_RDI[local_38 + 0x4b] + 1;
      *(long *)(in_RDX + local_38 * 8) = (in_RDI[local_38 + 0x59] + 1) * in_RDI[local_38 + 0x4b];
      if (in_RDI[local_38 + 0x2f] < *(long *)(in_RDX + local_38 * 8)) {
        *(long *)(in_RDX + local_38 * 8) = in_RDI[local_38 + 0x2f];
      }
    }
    pnga_access_block_grid_ptr
              (in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
    in_RDI[0x59] = in_RDI[0x36] + in_RDI[0x59];
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      if ((in_RDI[local_38 + 0x28] <= in_RDI[local_38 + 0x59]) && (local_38 < iVar2 + -1)) {
        in_RDI[local_38 + 0x59] = in_RDI[local_38 + 0x52];
        in_RDI[local_38 + 0x5a] = in_RDI[local_38 + 0x37] + in_RDI[local_38 + 0x5a];
      }
    }
  }
  else if (GA[lVar3].distr_type == 4) {
    local_68 = 0;
    if (in_RDI[(long)(iVar2 + -1) + 0x28] <= in_RDI[(long)(iVar2 + -1) + 0x59]) {
      return 0;
    }
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      *(undefined8 *)(in_RSI + local_38 * 8) =
           *(undefined8 *)(in_RDI[0x13] + (local_68 + in_RDI[local_38 + 0x59]) * 8);
      if (in_RDI[local_38 + 0x59] < in_RDI[local_38 + 0x28] + -1) {
        *(long *)(in_RDX + local_38 * 8) =
             *(long *)(in_RDI[0x13] + 8 + (local_68 + in_RDI[local_38 + 0x59]) * 8) + -1;
      }
      else {
        *(C_Integer *)(in_RDX + local_38 * 8) = GA[lVar3].dims[local_38];
      }
      local_68 = GA[lVar3].num_blocks[local_38] + local_68;
    }
    pnga_access_block_grid_ptr
              (in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
    in_RDI[0x59] = in_RDI[0x36] + in_RDI[0x59];
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      if ((in_RDI[local_38 + 0x28] <= in_RDI[local_38 + 0x59]) && (local_38 < iVar2 + -1)) {
        in_RDI[local_38 + 0x59] = in_RDI[local_38 + 0x52];
        in_RDI[local_38 + 0x5a] = in_RDI[local_38 + 0x37] + in_RDI[local_38 + 0x5a];
      }
    }
  }
  return 1;
}

Assistant:

int pnga_local_iterator_next(_iterator_hdl *hdl, Integer plo[],
    Integer phi[], char **ptr, Integer ld[])
{
  Integer i;
  Integer handle = GA_OFFSET + hdl->g_a;
  Integer grp = GA[handle].p_handle;
  Integer elemsize = GA[handle].elemsize;
  int ndim;
  int me = pnga_pgroup_nodeid(grp);
  ndim = GA[handle].ndim;
  if (GA[handle].distr_type == REGULAR) {
    Integer nelems;
    /* no blocks left, so return */
    if (hdl->count>0) return 0;

    /* Find  visible portion of patch held by this processor and
     * return the result in plo and phi. Return pointer to local
     * data as well
     */
    pnga_distribution(hdl->g_a, me, plo, phi);
    /* Check to see if this process has any data. Return 0 if
     * it does not */
    for (i=0; i<ndim; i++) {
      if (phi[i]<plo[i]) return 0;
    }
    pnga_access_ptr(hdl->g_a,plo,phi,ptr,ld);
    hdl->count++;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* Simple block-cyclic distribution */
    if (hdl->count >= pnga_total_blocks(hdl->g_a)) return 0;
    pnga_distribution(hdl->g_a,hdl->count,plo,phi);
    pnga_access_block_ptr(hdl->g_a,hdl->count,ptr,ld);
    hdl->count += pnga_pgroup_nnodes(grp);
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED) {
    /* Scalapack-type data distribution */
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->index[i]*hdl->blk_size[i]+1;
      phi[i] = (hdl->index[i]+1)*hdl->blk_size[i];
      if (phi[i] > hdl->blk_dim[i]) phi[i] = hdl->blk_dim[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  } else if (GA[handle].distr_type == TILED_IRREG) {
    /* Irregular tiled data distribution */
    Integer offset = 0;
    if (hdl->index[ndim-1] >= hdl->blk_num[ndim-1]) return 0;
    /* Find coordinates of bounding block */
    for (i=0; i<ndim; i++) {
      plo[i] = hdl->mapc[offset+hdl->index[i]];
      if (hdl->index[i] < hdl->blk_num[i]-1) {
        phi[i] = hdl->mapc[offset+hdl->index[i]+1]-1;
      } else {
        phi[i] = GA[handle].dims[i];
      }
      offset += GA[handle].num_blocks[i];
    }
    pnga_access_block_grid_ptr(hdl->g_a,hdl->index,ptr,ld);
    hdl->index[0] += hdl->blk_inc[0];
    for (i=0; i<ndim; i++) {
      if (hdl->index[i] >= hdl->blk_num[i] && i<ndim-1) {
        hdl->index[i] = hdl->proc_index[i];
        hdl->index[i+1] += hdl->blk_inc[i+1];
      }
    }
  }
  return 1;
}